

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

void button_binding_grab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  toggle_modifiers *ptVar1;
  ulong uVar2;
  ushort *local_40;
  uint16_t *mask;
  toggle_modifiers *modifiers;
  button_binding *binding_local;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  uVar2 = 0;
  xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                  binding->keyboard_mode,0,binding->cursor,binding->button,binding->modifiers);
  ptVar1 = state->button_state->modifiers;
  if (ptVar1 != (toggle_modifiers *)0x0) {
    for (local_40 = ptVar1->masks; *local_40 != 0; local_40 = local_40 + 1) {
      uVar2 = uVar2 & 0xffffffff00000000;
      xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                      binding->keyboard_mode,uVar2,binding->cursor,binding->button,
                      binding->modifiers | *local_40);
    }
  }
  return;
}

Assistant:

void button_binding_grab(const struct natwm_state *state, xcb_window_t window,
                         const struct button_binding *binding)
{
        xcb_grab_button(state->xcb,
                        binding->pass_event,
                        window,
                        binding->mask,
                        binding->pointer_mode,
                        binding->keyboard_mode,
                        XCB_NONE,
                        binding->cursor,
                        binding->button,
                        binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; mask++) {
                xcb_grab_button(state->xcb,
                                binding->pass_event,
                                window,
                                binding->mask,
                                binding->pointer_mode,
                                binding->keyboard_mode,
                                XCB_NONE,
                                binding->cursor,
                                binding->button,
                                binding->modifiers | *mask);
        }
}